

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O0

void anon_unknown.dwarf_18672a::DirectorySearch(char *path,char *ext,vector<std::string> *results)

{
  int iVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  iterator pbVar5;
  undefined8 uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  *in_RDX;
  char *in_RSI;
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end1;
  iterator __begin1;
  span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  *__range1;
  span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  newlist;
  string *str;
  size_t len;
  dirent *dirent;
  size_t extlen;
  size_type base;
  DIR *dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  *in_stack_ffffffffffffff70;
  FILE *__stream;
  iterator local_68;
  span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  local_58;
  reference local_48;
  size_t local_40;
  dirent *local_38;
  size_t local_30;
  size_type local_28;
  DIR *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  *local_18;
  char *local_10;
  char *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (2 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Searching %s for *%s\n",in_RDI,in_RSI);
  }
  local_20 = opendir(local_8);
  if (local_20 != (DIR *)0x0) {
    local_28 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
               ::size(local_18);
    local_30 = strlen(local_10);
    while (local_38 = readdir(local_20), local_38 != (dirent *)0x0) {
      iVar1 = strcmp(local_38->d_name,".");
      if ((((iVar1 != 0) && (iVar1 = strcmp(local_38->d_name,".."), iVar1 != 0)) &&
          (local_40 = strlen(local_38->d_name), local_30 < local_40)) &&
         (iVar1 = al::strcasecmp((char *)((long)local_38 + ((local_40 + 0x13) - local_30)),local_10)
         , iVar1 == 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::emplace_back<>(in_stack_ffffffffffffff70);
        local_48 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   ::back(in_stack_ffffffffffffff70);
        std::__cxx11::string::operator=((string *)local_48,local_8);
        pcVar2 = (char *)std::__cxx11::string::back();
        if (*pcVar2 != '/') {
          std::__cxx11::string::push_back((char)local_48);
        }
        std::__cxx11::string::operator+=((string *)local_48,local_38->d_name);
      }
    }
    closedir(local_20);
    pbVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             ::data((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                     *)0x1f2805);
    pbVar3 = pbVar3 + local_28;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
            ::size(local_18);
    al::
    span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
    ::span(&local_58,pbVar3,sVar4 - local_28);
    pbVar5 = al::
             span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
             ::begin(&local_58);
    al::
    span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
    ::end(&local_58);
    std::sort<std::__cxx11::string*>(pbVar5,pbVar3);
    local_68 = al::
               span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
               ::begin(&local_58);
    pbVar5 = al::
             span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
             ::end(&local_58);
    for (; local_68 != pbVar5; local_68 = local_68 + 1) {
      if (2 < (int)gLogLevel) {
        __stream = (FILE *)gLogFile;
        uVar6 = std::__cxx11::string::c_str();
        fprintf(__stream,"[ALSOFT] (II)  got %s\n",uVar6);
      }
    }
  }
  return;
}

Assistant:

void DirectorySearch(const char *path, const char *ext, al::vector<std::string> *const results)
{
    TRACE("Searching %s for *%s\n", path, ext);
    DIR *dir{opendir(path)};
    if(!dir) return;

    const auto base = results->size();
    const size_t extlen{strlen(ext)};

    while(struct dirent *dirent{readdir(dir)})
    {
        if(strcmp(dirent->d_name, ".") == 0 || strcmp(dirent->d_name, "..") == 0)
            continue;

        const size_t len{strlen(dirent->d_name)};
        if(len <= extlen) continue;
        if(al::strcasecmp(dirent->d_name+len-extlen, ext) != 0)
            continue;

        results->emplace_back();
        std::string &str = results->back();
        str = path;
        if(str.back() != '/')
            str.push_back('/');
        str += dirent->d_name;
    }
    closedir(dir);

    const al::span<std::string> newlist{results->data()+base, results->size()-base};
    std::sort(newlist.begin(), newlist.end());
    for(const auto &name : newlist)
        TRACE(" got %s\n", name.c_str());
}